

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::WordBoundaryTestInst<true>::Exec
          (WordBoundaryTestInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar2 = *inputOffset;
  bVar5 = 0;
  if ((ulong)uVar2 != 0) {
    bVar5 = 0;
    if ((ulong)(ushort)input[uVar2 - 1] < 0x100) {
      bVar5 = ASCIIChars::classes[(ushort)input[uVar2 - 1]] & 1;
    }
  }
  bVar3 = 0;
  if ((uVar2 < inputLength) && (bVar3 = 0, (ulong)(ushort)input[uVar2] < 0x100)) {
    bVar3 = ASCIIChars::classes[(ushort)input[uVar2]] & 1;
  }
  if (bVar5 == bVar3) {
    *instPointer = *instPointer + 1;
    bVar4 = false;
  }
  else {
    bVar4 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return bVar4;
}

Assistant:

inline bool WordBoundaryTestInst<isNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        const bool prev = inputOffset > 0 && matcher.standardChars->IsWord(input[inputOffset - 1]);
        const bool curr = inputOffset < inputLength && matcher.standardChars->IsWord(input[inputOffset]);
        if (isNegation == (prev != curr))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer += sizeof(*this);
        return false;
    }